

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

void __thiscall
gl4cts::GLSL420Pack::BindingUniformAPIOverirdeTest::prepareUniforms
          (BindingUniformAPIOverirdeTest *this,program *program)

{
  int iVar1;
  deUint32 dVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  TestError *this_00;
  buffer *this_01;
  GLint binding;
  undefined8 uStack_38;
  long lVar3;
  
  uStack_38 = in_RAX;
  iVar1 = (*((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  iVar1 = (**(code **)(lVar3 + 0xb38))(program->m_program_object_id,"GOKU");
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetUniformBlockIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x2465);
  if (iVar1 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Uniform block is inactive",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x2468);
  }
  else {
    (**(code **)(lVar3 + 0x15d0))(program->m_program_object_id,iVar1,0xb);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"UniformBlockBinding",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x246d);
    uStack_38 = CONCAT44(0xffffffff,(undefined4)uStack_38);
    (**(code **)(lVar3 + 0x760))(program->m_program_object_id,iVar1,0x8a3f,(long)&uStack_38 + 4);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"GetActiveUniformBlockiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x2472);
    if (uStack_38._4_4_ == 0xb) {
      this_01 = &this->m_goku_buffer;
      Utils::buffer::generate(this_01,0x8a11);
      Utils::buffer::update(this_01,0x20,prepareUniforms::goku_data,0x88e4);
      Utils::buffer::bindRange(this_01,0xb,0,0x20);
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"GetActiveUniformBlockiv returned wrong binding",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x2476);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BindingUniformAPIOverirdeTest::prepareUniforms(Utils::program& program)
{
	static const GLfloat goku_data[8] = { 1.0f, 0.0f, 0.0f, 0.0f, 0.0f, 1.0f, 0.0f, 0.0f };

	static const GLuint new_binding = 11;

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const GLuint index = gl.getUniformBlockIndex(program.m_program_object_id, "GOKU");
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformBlockIndex");
	if (GL_INVALID_INDEX == index)
	{
		TCU_FAIL("Uniform block is inactive");
		return;
	}

	gl.uniformBlockBinding(program.m_program_object_id, index, new_binding);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformBlockBinding");

	GLint binding = -1;

	gl.getActiveUniformBlockiv(program.m_program_object_id, index, GL_UNIFORM_BLOCK_BINDING, &binding);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformBlockiv");

	if (new_binding != binding)
	{
		TCU_FAIL("GetActiveUniformBlockiv returned wrong binding");
		return;
	}

	m_goku_buffer.generate(GL_UNIFORM_BUFFER);
	m_goku_buffer.update(sizeof(GLfloat) * 8, (GLvoid*)goku_data, GL_STATIC_DRAW);
	m_goku_buffer.bindRange(new_binding /* index */, 0 /* offset */, sizeof(GLfloat) * 8);
}